

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_meshb(REF_GRID ref_grid,char *filename)

{
  int iVar1;
  REF_NODE ref_node;
  REF_GEOM pRVar2;
  REF_INT *pRVar3;
  REF_SIZE RVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  REF_STATUS RVar11;
  REF_STATUS RVar12;
  uint uVar13;
  FILE *__s;
  size_t sVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  REF_CELL pRVar18;
  size_t sVar19;
  byte bVar20;
  ulong uVar21;
  REF_INT RVar22;
  REF_LONG ref_private_status_reis_ai;
  REF_LONG ref_private_status_reis_ai_3;
  REF_INT keyword_code;
  REF_LONG ref_private_status_reis_ai_2;
  REF_INT dim;
  REF_INT *n2o;
  REF_INT *o2n;
  double double_gref;
  REF_INT code;
  uint local_118;
  int local_114;
  REF_CELL local_110;
  ulong local_108;
  REF_GEOM local_100;
  int local_f4;
  ulong local_f0;
  ulong local_e8;
  REF_INT *local_e0;
  ulong local_d8;
  REF_INT *local_d0;
  uint local_c4;
  long local_c0;
  double local_b8;
  undefined4 local_ac;
  REF_INT local_a8;
  undefined8 local_a4;
  undefined8 local_9c;
  
  ref_node = ref_grid->node;
  pRVar2 = ref_grid->geom;
  local_f4 = (ref_grid->twod == 0) + 2;
  local_114 = 2;
  iVar9 = ref_grid->meshb_version;
  if ((ref_grid->meshb_version < 2) && (iVar9 = local_114, 10000000 < ref_node->old_n_global)) {
    iVar9 = (200000000 < ref_node->old_n_global) + 3;
  }
  local_114 = iVar9;
  local_110 = (REF_CELL)CONCAT44(local_110._4_4_,local_114);
  bVar5 = 2 < local_114;
  bVar6 = 3 < local_114;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x79d,
           "ref_export_meshb","unable to open file");
    uVar10 = 2;
  }
  else {
    uVar10 = ref_node_compact(ref_node,&local_d0,&local_e0);
    if (uVar10 == 0) {
      local_ac = 1;
      local_100 = pRVar2;
      sVar14 = fwrite(&local_ac,4,1,__s);
      if (sVar14 == 1) {
        sVar14 = fwrite(&local_114,4,1,__s);
        if (sVar14 == 1) {
          lVar15 = ftell(__s);
          local_118 = 3;
          sVar14 = fwrite(&local_118,4,1,__s);
          iVar9 = local_114;
          if (sVar14 == 1) {
            local_108 = (ulong)bVar5;
            lVar15 = (ulong)((uint)bVar5 * 4 + 8) + 4 + lVar15;
            uVar10 = ref_export_meshb_next_position((FILE *)__s,local_114,lVar15);
            if (uVar10 == 0) {
              sVar14 = fwrite(&local_f4,4,1,__s);
              if (sVar14 == 1) {
                lVar16 = ftell(__s);
                if (lVar15 == lVar16) {
                  local_f0 = (ulong)((uint)bVar6 * 4 + 4);
                  iVar1 = ref_node->n;
                  local_e8 = (ulong)((uint)bVar6 * 4 + (int)local_108 * 4 + 0xc);
                  if (0 < (long)iVar1) {
                    lVar15 = (long)local_f4;
                    lVar16 = ftell(__s);
                    local_118 = 4;
                    sVar14 = fwrite(&local_118,4,1,__s);
                    if (sVar14 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x7b1,"ref_export_meshb","vertex version code",1,sVar14);
                      return 1;
                    }
                    lVar15 = lVar16 + local_e8 +
                             ((local_f0 & 0xffffffff) + lVar15 * 8) * (long)iVar1;
                    uVar10 = ref_export_meshb_next_position((FILE *)__s,iVar9,lVar15);
                    if (uVar10 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x7b2,"ref_export_meshb",(ulong)uVar10,"next p");
                      return uVar10;
                    }
                    RVar11 = ref_export_meshb_int((FILE *)__s,iVar9,ref_node->n);
                    if (RVar11 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x7b3,"ref_export_meshb",1,"nnode");
                      return 1;
                    }
                    if (0 < ref_node->n) {
                      lVar16 = 0;
                      do {
                        sVar14 = fwrite(ref_node->real + (long)local_e0[lVar16] * 0xf,8,1,__s);
                        if (sVar14 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                 ,0x7b8,"ref_export_meshb","x",1,sVar14);
                          return 1;
                        }
                        sVar14 = fwrite(ref_node->real + (long)local_e0[lVar16] * 0xf + 1,8,1,__s);
                        if (sVar14 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                 ,0x7bc,"ref_export_meshb","y",1,sVar14);
                          return 1;
                        }
                        if ((ref_grid->twod == 0) &&
                           (sVar14 = fwrite(ref_node->real + (long)local_e0[lVar16] * 0xf + 2,8,1,
                                            __s), sVar14 != 1)) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                 ,0x7c1,"ref_export_meshb","z",1,sVar14);
                          return 1;
                        }
                        RVar11 = ref_export_meshb_int((FILE *)__s,iVar9,1);
                        if (RVar11 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                 ,0x7c3,"ref_export_meshb",1,"nnode");
                          return 1;
                        }
                        lVar16 = lVar16 + 1;
                      } while (lVar16 < ref_node->n);
                    }
                    lVar16 = ftell(__s);
                    if (lVar15 != lVar16) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x7c5,"ref_export_meshb","vertex inconsistent",lVar15,lVar16);
                      return 1;
                    }
                  }
                  local_c4 = (int)local_110 < 4 ^ 3;
                  lVar15 = 0;
                  RVar11 = 0;
                  do {
                    pRVar18 = ref_grid->cell[lVar15];
                    if (0 < pRVar18->n) {
                      local_110 = pRVar18;
                      local_c0 = lVar15;
                      uVar10 = ref_cell_meshb_keyword(pRVar18,(REF_INT *)&local_118);
                      pRVar18 = local_110;
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7ca,"ref_export_meshb",(ulong)uVar10,"kw");
                        return uVar10;
                      }
                      iVar1 = local_110->node_per;
                      lVar15 = ftell(__s);
                      local_108 = (ulong)pRVar18->n;
                      bVar20 = (byte)local_c4;
                      local_d8 = (long)iVar1;
                      sVar14 = fwrite(&local_118,4,1,__s);
                      if (sVar14 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,1999,"ref_export_meshb","keyword code",1,sVar14);
                        return 1;
                      }
                      local_108 = local_108 * (long)(iVar1 + 1 << (bVar20 & 0x1f)) +
                                  lVar15 + local_e8;
                      uVar10 = ref_export_meshb_next_position((FILE *)__s,iVar9,local_108);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,2000,"ref_export_meshb",(ulong)uVar10,"next");
                        return uVar10;
                      }
                      uVar10 = ref_export_meshb_int((FILE *)__s,iVar9,local_110->n);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7d1,"ref_export_meshb",(ulong)uVar10,"ncell");
                        return uVar10;
                      }
                      if (0 < local_110->max) {
                        iVar1 = (int)local_d8;
                        uVar17 = local_d8 & 0xffffffff;
                        uVar10 = (int)local_d8 + 1;
                        RVar22 = 0;
                        do {
                          RVar12 = ref_cell_nodes(local_110,RVar22,&local_a8);
                          if (RVar12 == 0) {
                            if (0 < (int)local_d8) {
                              uVar21 = 0;
                              do {
                                (&local_a8)[uVar21] = local_d0[(&local_a8)[uVar21]] + 1;
                                uVar21 = uVar21 + 1;
                              } while (uVar17 != uVar21);
                            }
                            uVar8 = local_a4;
                            if (local_110->type == REF_CELL_PYR) {
                              local_a4 = local_9c;
                              local_9c = uVar8;
                            }
                            if (local_110->last_node_is_an_id == 0) {
                              (&local_a8)[local_d8] = 0;
                            }
                            if (-1 < iVar1) {
                              uVar21 = 0;
                              do {
                                RVar12 = ref_export_meshb_int((FILE *)__s,iVar9,(&local_a8)[uVar21])
                                ;
                                if (RVar12 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                         ,0x7e7,"ref_export_meshb",1,"c2n");
                                  return 1;
                                }
                                uVar21 = uVar21 + 1;
                              } while (uVar10 != uVar21);
                            }
                          }
                          RVar22 = RVar22 + 1;
                        } while (RVar22 < local_110->max);
                      }
                      uVar17 = ftell(__s);
                      if (local_108 != uVar17) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7ea,"ref_export_meshb","cell inconsistent",local_108,uVar17);
                        RVar11 = 1;
                      }
                      lVar15 = local_c0;
                      if (local_108 != uVar17) {
                        return RVar11;
                      }
                    }
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 0x10);
                  local_f0 = (ulong)(uint)((int)local_f0 * 2);
                  uVar17 = 0;
                  do {
                    uVar10 = 0;
                    if (0 < (long)local_100->max) {
                      lVar15 = 0;
                      uVar10 = 0;
                      do {
                        uVar10 = uVar10 + (uVar17 == *(uint *)((long)local_100->descr + lVar15));
                        lVar15 = lVar15 + 0x18;
                      } while ((long)local_100->max * 0x18 != lVar15);
                    }
                    if (0 < (int)uVar10) {
                      local_118 = (uint)uVar17 | 0x28;
                      lVar15 = ftell(__s);
                      sVar14 = fwrite(&local_118,4,1,__s);
                      if (sVar14 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7f7,"ref_export_meshb","keyword",1,sVar14);
                        return 1;
                      }
                      local_110 = (REF_CELL)
                                  (lVar15 + local_e8 +
                                  (local_f0 + uVar17 * 8 + (ulong)(uVar17 != 0) * 8) * (ulong)uVar10
                                  );
                      uVar13 = ref_export_meshb_next_position
                                         ((FILE *)__s,iVar9,(REF_FILEPOS)local_110);
                      if (uVar13 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7f8,"ref_export_meshb",(ulong)uVar13,"next");
                        return uVar13;
                      }
                      RVar12 = ref_export_meshb_int((FILE *)__s,iVar9,uVar10);
                      if (RVar12 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x7f9,"ref_export_meshb",1,"ngeom");
                        return 1;
                      }
                      if (0 < local_100->max) {
                        lVar15 = 0;
                        lVar16 = 0;
                        do {
                          pRVar3 = local_100->descr;
                          if (uVar17 == (uint)pRVar3[lVar16 * 6]) {
                            RVar22 = pRVar3[lVar16 * 6 + 1];
                            local_108 = lVar16 * 6;
                            RVar12 = ref_export_meshb_int
                                               ((FILE *)__s,iVar9,
                                                local_d0[pRVar3[lVar16 * 6 + 5]] + 1);
                            if (RVar12 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                     ,0x7fd,"ref_export_meshb",1,"node");
                              return 1;
                            }
                            RVar12 = ref_export_meshb_int((FILE *)__s,iVar9,RVar22);
                            lVar7 = lVar15;
                            uVar21 = uVar17;
                            if (RVar12 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                     ,0x7fe,"ref_export_meshb",1,"id");
                              return 1;
                            }
                            for (; uVar21 != 0; uVar21 = uVar21 - 1) {
                              sVar14 = fwrite((void *)((long)local_100->param + lVar7),8,1,__s);
                              if (sVar14 != 1) {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                       ,0x803,"ref_export_meshb","id",1,sVar14);
                                return 1;
                              }
                              lVar7 = lVar7 + 8;
                            }
                            if (uVar17 != 0) {
                              local_b8 = (double)local_100->descr[local_108 + 2];
                              sVar14 = fwrite(&local_b8,8,1,__s);
                              if (sVar14 != 1) {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                                       ,0x806,"ref_export_meshb","gref",1,sVar14);
                                return 1;
                              }
                            }
                          }
                          lVar16 = lVar16 + 1;
                          lVar15 = lVar15 + 0x10;
                        } while (lVar16 < local_100->max);
                      }
                      pRVar18 = (REF_CELL)ftell(__s);
                      if (local_110 != pRVar18) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                               ,0x809,"ref_export_meshb","geom inconsistent",local_110,pRVar18);
                        RVar11 = 1;
                      }
                      if (local_110 != pRVar18) {
                        return RVar11;
                      }
                    }
                    uVar17 = uVar17 + 1;
                  } while (uVar17 != 3);
                  RVar4 = local_100->cad_data_size;
                  if (RVar4 != 0) {
                    local_118 = 0x7e;
                    lVar15 = ftell(__s);
                    sVar14 = fwrite(&local_118,4,1,__s);
                    iVar9 = local_114;
                    if (sVar14 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x811,"ref_export_meshb","keyword",1,sVar14);
                      return 1;
                    }
                    lVar15 = RVar4 + local_e8 + lVar15;
                    uVar10 = ref_export_meshb_next_position((FILE *)__s,local_114,lVar15);
                    if (uVar10 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x812,"ref_export_meshb",(ulong)uVar10,"next p");
                      return uVar10;
                    }
                    RVar11 = ref_export_meshb_int
                                       ((FILE *)__s,iVar9,(REF_INT)local_100->cad_data_size);
                    if (RVar11 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x814,"ref_export_meshb",1,"size in bytes");
                      return 1;
                    }
                    sVar14 = local_100->cad_data_size;
                    sVar19 = fwrite(local_100->cad_data,1,sVar14,__s);
                    if (sVar14 != sVar19) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x818,"ref_export_meshb","node",sVar14,sVar19);
                      return 1;
                    }
                    lVar16 = ftell(__s);
                    if (lVar15 != lVar16) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x819,"ref_export_meshb","cad_model inconsistent",lVar15,lVar16);
                      return 1;
                    }
                  }
                  local_118 = 0x36;
                  sVar14 = fwrite(&local_118,4,1,__s);
                  if (sVar14 == 1) {
                    uVar10 = ref_export_meshb_next_position((FILE *)__s,local_114,0);
                    if (uVar10 == 0) {
                      if (local_e0 != (REF_INT *)0x0) {
                        free(local_e0);
                      }
                      if (local_d0 != (REF_INT *)0x0) {
                        free(local_d0);
                      }
                      fclose(__s);
                      uVar10 = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                             ,0x820,"ref_export_meshb",(ulong)uVar10,"next p");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                           ,0x81e,"ref_export_meshb","vertex version code",1,sVar14);
                    uVar10 = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x7a9,"ref_export_meshb","dim inconsistent",lVar15,lVar16);
                  uVar10 = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x7a8,"ref_export_meshb","dim",1,sVar14);
                uVar10 = 1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x7a7,"ref_export_meshb",(ulong)uVar10,"next pos");
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x7a6,"ref_export_meshb","dim code",1,sVar14);
            uVar10 = 1;
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x7a3,"ref_export_meshb","version",1,sVar14);
          uVar10 = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x7a2,"ref_export_meshb","code",1,sVar14);
        uVar10 = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x79f,"ref_export_meshb",(ulong)uVar10,"compact");
    }
  }
  return uVar10;
}

Assistant:

REF_FCN static REF_STATUS ref_export_meshb(REF_GRID ref_grid,
                                           const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT *o2n, *n2o;
  REF_INT code, version, dim;
  REF_FILEPOS next_position;
  REF_INT keyword_code, header_size, int_size, fp_size;
  REF_INT node;
  REF_INT group, node_per, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER + 1]; /* everyone gets id in meshb */
  REF_INT type, id, i, size_bytes;
  REF_INT n0, n1, n2, n3, n4;
  REF_INT geom;
  int ngeom;

  dim = 3;
  if (ref_grid_twod(ref_grid)) dim = 2;

  version = 2;
  if (1 < ref_grid_meshb_version(ref_grid)) {
    version = ref_grid_meshb_version(ref_grid);
  } else {
    if (REF_EXPORT_MESHB_VERTEX_3 < ref_node_n_global(ref_node)) version = 3;
    if (REF_EXPORT_MESHB_VERTEX_4 < ref_node_n_global(ref_node)) version = 4;
  }

  int_size = 4;
  fp_size = 4;
  if (2 < version) fp_size = 8;
  if (3 < version) int_size = 8;
  header_size = 4 + fp_size + int_size;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  code = 1;
  REIS(1, fwrite(&code, sizeof(int), 1, file), "code");
  REIS(1, fwrite(&version, sizeof(int), 1, file), "version");
  next_position = (REF_FILEPOS)(4 + fp_size + 4) + ftell(file);
  keyword_code = 3;
  REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "dim code");
  RSS(ref_export_meshb_next_position(file, version, next_position), "next pos");
  REIS(1, fwrite(&dim, sizeof(int), 1, file), "dim");
  REIS(next_position, ftell(file), "dim inconsistent");

  if (ref_node_n(ref_node) > 0) {
    next_position =
        (REF_FILEPOS)header_size +
        (REF_FILEPOS)ref_node_n(ref_node) * (REF_FILEPOS)(dim * 8 + int_size) +
        ftell(file);
    keyword_code = 4;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "vertex version code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    RSS(ref_export_meshb_int(file, version, ref_node_n(ref_node)), "nnode");
    for (node = 0; node < ref_node_n(ref_node); node++) {
      REIS(1,
           fwrite(&(ref_node_xyz(ref_node, 0, n2o[node])), sizeof(double), 1,
                  file),
           "x");
      REIS(1,
           fwrite(&(ref_node_xyz(ref_node, 1, n2o[node])), sizeof(double), 1,
                  file),
           "y");
      if (!ref_grid_twod(ref_grid))
        REIS(1,
             fwrite(&(ref_node_xyz(ref_node, 2, n2o[node])), sizeof(double), 1,
                    file),
             "z");
      RSS(ref_export_meshb_int(file, version, REF_EXPORT_MESHB_VERTEX_ID),
          "nnode");
    }
    REIS(next_position, ftell(file), "vertex inconsistent");
  }

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (ref_cell_n(ref_cell) > 0) {
      RSS(ref_cell_meshb_keyword(ref_cell, &keyword_code), "kw");
      node_per = ref_cell_node_per(ref_cell);
      next_position = ftell(file) + (REF_FILEPOS)header_size +
                      (REF_FILEPOS)ref_cell_n(ref_cell) *
                          (REF_FILEPOS)(int_size * (node_per + 1));
      REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword code");
      RSS(ref_export_meshb_next_position(file, version, next_position), "next");
      RSS(ref_export_meshb_int(file, version, ref_cell_n(ref_cell)), "ncell");
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = o2n[nodes[node]] + 1;
        }
        if (REF_CELL_PYR == ref_cell_type(ref_cell)) {
          /* convention: square basis is 0-1-2-3
             (oriented counter clockwise like trias) and top vertex is 4 */
          n0 = nodes[0];
          n1 = nodes[3];
          n2 = nodes[4];
          n3 = nodes[1];
          n4 = nodes[2];
          nodes[0] = n0;
          nodes[1] = n1;
          nodes[2] = n2;
          nodes[3] = n3;
          nodes[4] = n4;
        }
        if (!ref_cell_last_node_is_an_id(ref_cell))
          nodes[node_per] = REF_EXPORT_MESHB_3D_ID;
        for (node = 0; node < (1 + node_per); node++) {
          RSS(ref_export_meshb_int(file, version, nodes[node]), "c2n");
        }
      }
      REIS(next_position, ftell(file), "cell inconsistent");
    }
  }

  each_ref_type(ref_geom, type) {
    ngeom = 0;
    each_ref_geom_of(ref_geom, type, geom) ngeom++;
    if (ngeom > 0) {
      keyword_code = 40 + type; /* GmfVerticesOnGeometricVertices */
      next_position =
          ftell(file) + (REF_FILEPOS)header_size +
          (REF_FILEPOS)ngeom *
              (REF_FILEPOS)(int_size * 2 + 8 * type + (0 < type ? 8 : 0));
      REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword");
      RSS(ref_export_meshb_next_position(file, version, next_position), "next");
      RSS(ref_export_meshb_int(file, version, ngeom), "ngeom");
      each_ref_geom_of(ref_geom, type, geom) {
        node = o2n[ref_geom_node(ref_geom, geom)] + 1;
        id = ref_geom_id(ref_geom, geom);
        RSS(ref_export_meshb_int(file, version, node), "node");
        RSS(ref_export_meshb_int(file, version, id), "id");
        for (i = 0; i < type; i++)
          REIS(1,
               fwrite(&(ref_geom_param(ref_geom, i, geom)), sizeof(double), 1,
                      file),
               "id");
        if (0 < type) {
          double double_gref = (double)ref_geom_gref(ref_geom, geom);
          REIS(1, fwrite(&(double_gref), sizeof(double), 1, file), "gref");
        }
      }
      REIS(next_position, ftell(file), "geom inconsistent");
    }
  }

  if (0 < ref_geom_cad_data_size(ref_geom)) {
    keyword_code = 126; /* GmfByteFlow 173-47 */
    next_position = (REF_FILEPOS)header_size +
                    (REF_FILEPOS)ref_geom_cad_data_size(ref_geom) + ftell(file);
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    size_bytes = (REF_INT)ref_geom_cad_data_size(ref_geom);
    RSS(ref_export_meshb_int(file, version, size_bytes), "size in bytes");
    REIS(ref_geom_cad_data_size(ref_geom),
         fwrite(ref_geom_cad_data(ref_geom), sizeof(REF_BYTE),
                ref_geom_cad_data_size(ref_geom), file),
         "node");
    REIS(next_position, ftell(file), "cad_model inconsistent");
  }

  /* End */
  keyword_code = 54; /* GmfEnd 101-47 */
  REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "vertex version code");
  next_position = 0;
  RSS(ref_export_meshb_next_position(file, version, next_position), "next p");

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}